

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cpp
# Opt level: O0

int cppcms::anon_unknown_11::reactor_type(string *name)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
  if (bVar1) {
    local_4 = 1;
  }
  else {
    bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
    if (bVar1) {
      local_4 = 2;
    }
    else {
      bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
      if (bVar1) {
        local_4 = 3;
      }
      else {
        bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
        if (bVar1) {
          local_4 = 4;
        }
        else {
          bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
          if (bVar1) {
            local_4 = 5;
          }
          else {
            local_4 = 0;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int reactor_type(std::string const &name)
	{
		using booster::aio::reactor;
		if(name=="select")
			return reactor::use_select;
		if(name=="poll")
			return reactor::use_poll;
		if(name=="epoll")
			return reactor::use_epoll;
		if(name=="devpoll")
			return reactor::use_dev_poll;
		if(name=="kqueue")
			return reactor::use_kqueue;
		return reactor::use_default;
	}